

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

UAmbiguousConverter * ucnv_getAmbiguous(UConverter *cnv)

{
  UBool UVar1;
  int iVar2;
  char *__s1;
  int local_2c;
  int32_t i;
  char *name;
  UConverter *pUStack_18;
  UErrorCode errorCode;
  UConverter *cnv_local;
  
  if (cnv != (UConverter *)0x0) {
    name._4_4_ = U_ZERO_ERROR;
    pUStack_18 = cnv;
    __s1 = ucnv_getName_63(cnv,(UErrorCode *)((long)&name + 4));
    UVar1 = U_FAILURE(name._4_4_);
    if (UVar1 == '\0') {
      for (local_2c = 0; local_2c < 0xb; local_2c = local_2c + 1) {
        iVar2 = strcmp(__s1,ambiguousConverters[local_2c].name);
        if (iVar2 == 0) {
          return ambiguousConverters + local_2c;
        }
      }
    }
  }
  return (UAmbiguousConverter *)0x0;
}

Assistant:

static const UAmbiguousConverter *ucnv_getAmbiguous(const UConverter *cnv)
{
    UErrorCode errorCode;
    const char *name;
    int32_t i;

    if(cnv==NULL) {
        return NULL;
    }

    errorCode=U_ZERO_ERROR;
    name=ucnv_getName(cnv, &errorCode);
    if(U_FAILURE(errorCode)) {
        return NULL;
    }

    for(i=0; i<UPRV_LENGTHOF(ambiguousConverters); ++i)
    {
        if(0==uprv_strcmp(name, ambiguousConverters[i].name))
        {
            return ambiguousConverters+i;
        }
    }

    return NULL;
}